

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O3

void __thiscall pzgeom::TPZArc3D::Print(TPZArc3D *this,ostream *out)

{
  ostream *poVar1;
  
  TPZNodeRep<3,_pztopology::TPZLine>::Print(&this->super_TPZNodeRep<3,_pztopology::TPZLine>,out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"fCenter3D ",10);
  poVar1 = ::operator<<(out,&(this->fCenter3D).super_TPZVec<double>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," finitialVector ",0x10);
  poVar1 = ::operator<<(poVar1,&(this->finitialVector).super_TPZVec<double>);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fAngle ",7);
  poVar1 = std::ostream::_M_insert<double>(this->fAngle);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," fRadius ",9);
  poVar1 = std::ostream::_M_insert<double>(this->fRadius);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," fXcenter ",10);
  poVar1 = std::ostream::_M_insert<double>(this->fXcenter);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," fYcenter ",10);
  poVar1 = std::ostream::_M_insert<double>(this->fYcenter);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  TPZMatrix<double>::Print((TPZMatrix<double> *)&this->fICnBase,"fICnBase",out,EFormatted);
  TPZMatrix<double>::Print((TPZMatrix<double> *)&this->fIBaseCn,"fIBaseCn",out,EFormatted);
  return;
}

Assistant:

void Print(std::ostream &out) const
		{
			pzgeom::TPZNodeRep<3,pztopology::TPZLine>::Print(out);
			out << "fCenter3D " << fCenter3D << " finitialVector " << finitialVector << std::endl;
			out << "fAngle " << fAngle << " fRadius " << fRadius << " fXcenter " << fXcenter << " fYcenter " << fYcenter << std::endl;
			fICnBase.Print("fICnBase", out);
			fIBaseCn.Print("fIBaseCn", out);
		}